

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
* soul::StructuralParser::parseTopLevelDeclarations
            (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             *__return_storage_ptr__,Allocator *allocator,CodeLocation *code,
            Namespace *parentNamespace)

{
  size_type sVar1;
  __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
  local_110;
  __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
  local_108;
  const_iterator local_100;
  __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
  local_f8;
  const_iterator local_f0;
  undefined1 local_e1;
  undefined4 local_e0;
  int local_cc;
  undefined1 local_c8 [4];
  int oldNumModules;
  StructuralParser p;
  Namespace *parentNamespace_local;
  CodeLocation *code_local;
  Allocator *allocator_local;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *newModules;
  
  p.noop.object = (NoopStatement *)parentNamespace;
  StructuralParser((StructuralParser *)local_c8,allocator,code,&parentNamespace->super_ModuleBase);
  sVar1 = std::
          vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
          ::size((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                  *)&p.noop.object[10].super_Statement.super_ASTObject.context);
  local_cc = (int)sVar1;
  parseTopLevelDecls((StructuralParser *)local_c8,(Namespace *)p.noop.object);
  if (local_cc == 0) {
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::vector(__return_storage_ptr__,
             (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
              *)&p.noop.object[10].super_Statement.super_ASTObject.context);
  }
  else {
    local_e1 = 0;
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::vector(__return_storage_ptr__,
             (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
              *)&p.noop.object[10].super_Statement.super_ASTObject.context);
    local_f8._M_current =
         (pool_ref<soul::AST::ModuleBase> *)
         std::
         vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
         ::begin(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>const*,std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>>
    ::__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>*>
              ((__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>const*,std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>>
                *)&local_f0,&local_f8);
    local_110._M_current =
         (pool_ref<soul::AST::ModuleBase> *)
         std::
         vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
         ::begin(__return_storage_ptr__);
    local_108 = __gnu_cxx::
                __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
                ::operator+(&local_110,(long)local_cc);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>const*,std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>>
    ::__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>*>
              ((__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>const*,std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>>
                *)&local_100,&local_108);
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::erase(__return_storage_ptr__,local_f0,local_100);
    local_e1 = 1;
  }
  local_e0 = 1;
  ~StructuralParser((StructuralParser *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<pool_ref<AST::ModuleBase>> parseTopLevelDeclarations (AST::Allocator& allocator,
                                                                             CodeLocation code,
                                                                             AST::Namespace& parentNamespace)
    {
        StructuralParser p (allocator, code, parentNamespace);
        auto oldNumModules = static_cast<int> (parentNamespace.subModules.size());
        p.parseTopLevelDecls (parentNamespace);

        if (oldNumModules == 0)
            return parentNamespace.subModules;

        auto newModules = parentNamespace.subModules;
        newModules.erase (newModules.begin(), newModules.begin() + oldNumModules);
        return newModules;
    }